

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result wabt::TypeChecker::CheckType(Type actual,Type expected)

{
  Index IVar1;
  Index IVar2;
  Result RVar3;
  int in_ESI;
  int in_EDI;
  bool bVar4;
  Type local_18;
  Type local_10;
  
  if (in_EDI == 0 || in_ESI == 0) {
    bVar4 = false;
  }
  else {
    if (in_EDI == -0x15 && in_ESI == -0x15) {
      IVar1 = Type::GetReferenceIndex(&local_18);
      IVar2 = Type::GetReferenceIndex(&local_10);
      bVar4 = IVar1 == IVar2;
    }
    else {
      bVar4 = in_EDI == in_ESI;
    }
    bVar4 = !bVar4;
  }
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = bVar4;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::CheckType(Type actual, Type expected) {
  if (expected == Type::Any || actual == Type::Any) {
    return Result::Ok;
  }

  if (expected == Type::Reference && actual == Type::Reference) {
    return expected.GetReferenceIndex() == actual.GetReferenceIndex()
               ? Result::Ok
               : Result::Error;
  }
  if (actual != expected) {
    return Result::Error;
  }
  return Result::Ok;
}